

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

void __thiscall
gl4cts::CopyImage::TargetMissMatchTest::TargetMissMatchTest
          (TargetMissMatchTest *this,Context *context)

{
  bool bVar1;
  bool bVar2;
  undefined1 local_70 [8];
  testCase test_case_1;
  GLenum tex_target_1;
  GLenum src_target_1;
  GLenum dst_target_1;
  GLuint src;
  GLuint target_1;
  undefined1 local_3c [8];
  testCase test_case;
  GLenum tex_target;
  GLenum src_target;
  GLenum dst_target;
  GLuint dst;
  GLuint target;
  Context *context_local;
  TargetMissMatchTest *this_local;
  
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"target_miss_match",
             "Test verifies if INVALID_ENUM is generated when target provided to CopySubImageData does not match texture"
            );
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TargetMissMatchTest_0322e618;
  this->m_dst_buf_name = 0;
  this->m_dst_tex_name = 0;
  this->m_src_buf_name = 0;
  this->m_src_tex_name = 0;
  this->m_test_case_index = 0;
  std::
  vector<gl4cts::CopyImage::TargetMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::TargetMissMatchTest::testCase>_>
  ::vector(&this->m_test_cases);
  for (dst_target = 0; dst_target < 0xb; dst_target = dst_target + 1) {
    for (src_target = 0; src_target < 0xb; src_target = src_target + 1) {
      test_case.m_tex_target = *(GLenum *)(s_valid_targets + (ulong)src_target * 4);
      local_3c._4_4_ = *(undefined4 *)(s_valid_targets + (ulong)dst_target * 4);
      local_3c._0_4_ = *(undefined4 *)(s_valid_targets + (ulong)dst_target * 4);
      test_case.m_src_target = 0x500;
      test_case.m_dst_target = local_3c._0_4_;
      test_case.m_expected_result = local_3c._4_4_;
      if (((local_3c._0_4_ != 0x8d41) && (test_case.m_tex_target != 0x8d41)) &&
         (local_3c._4_4_ != 0x8d41)) {
        if (test_case.m_tex_target == local_3c._0_4_) {
          test_case.m_src_target = 0;
        }
        bVar1 = Utils::isTargetMultisampled(test_case.m_tex_target);
        bVar2 = Utils::isTargetMultisampled(test_case.m_expected_result);
        if (bVar1 == bVar2) {
          std::
          vector<gl4cts::CopyImage::TargetMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::TargetMissMatchTest::testCase>_>
          ::push_back(&this->m_test_cases,(value_type *)local_3c);
        }
      }
    }
  }
  for (dst_target_1 = 0; dst_target_1 < 0xb; dst_target_1 = dst_target_1 + 1) {
    for (src_target_1 = 0; src_target_1 < 0xb; src_target_1 = src_target_1 + 1) {
      test_case_1.m_tex_target = *(GLenum *)(s_valid_targets + (ulong)dst_target_1 * 4);
      local_70._4_4_ = *(undefined4 *)(s_valid_targets + (ulong)src_target_1 * 4);
      local_70._0_4_ = *(undefined4 *)(s_valid_targets + (ulong)dst_target_1 * 4);
      test_case_1.m_src_target = 0x500;
      if (((local_70._0_4_ != 0x8d41) && (test_case_1.m_tex_target != 0x8d41)) &&
         (local_70._4_4_ != 0x8d41)) {
        if (local_70._4_4_ == local_70._0_4_) {
          test_case_1.m_src_target = 0;
        }
        test_case_1.m_dst_target = local_70._0_4_;
        test_case_1.m_expected_result = local_70._4_4_;
        bVar1 = Utils::isTargetMultisampled(test_case_1.m_tex_target);
        bVar2 = Utils::isTargetMultisampled(test_case_1.m_expected_result);
        if (bVar1 == bVar2) {
          std::
          vector<gl4cts::CopyImage::TargetMissMatchTest::testCase,_std::allocator<gl4cts::CopyImage::TargetMissMatchTest::testCase>_>
          ::push_back(&this->m_test_cases,(value_type *)local_70);
        }
      }
    }
  }
  return;
}

Assistant:

TargetMissMatchTest::TargetMissMatchTest(deqp::Context& context)
	: TestCase(
		  context, "target_miss_match",
		  "Test verifies if INVALID_ENUM is generated when target provided to CopySubImageData does not match texture")
	, m_dst_buf_name(0)
	, m_dst_tex_name(0)
	, m_src_buf_name(0)
	, m_src_tex_name(0)
	, m_test_case_index(0)
{
	/* Wrong dst target */
	for (GLuint target = 0; target < s_n_valid_targets; ++target)
	{
		for (GLuint dst = 0; dst < s_n_valid_targets; ++dst)
		{
			const GLenum dst_target = s_valid_targets[dst];
			const GLenum src_target = s_valid_targets[target];
			const GLenum tex_target = s_valid_targets[target];
			testCase	 test_case  = { tex_target, src_target, dst_target, GL_INVALID_ENUM };

			/* Skip renderbuffers */
			if ((GL_RENDERBUFFER == tex_target) || (GL_RENDERBUFFER == dst_target) || (GL_RENDERBUFFER == src_target))
			{
				continue;
			}

			/* Valid case */
			if (dst_target == tex_target)
			{
				test_case.m_expected_result = GL_NO_ERROR;
			}

			/* Skip cases with multisampling conflict */
			if (Utils::isTargetMultisampled(dst_target) != Utils::isTargetMultisampled(src_target))
			{
				continue;
			}

			m_test_cases.push_back(test_case);
		}
	}

	/* Wrong src target */
	for (GLuint target = 0; target < s_n_valid_targets; ++target)
	{
		for (GLuint src = 0; src < s_n_valid_targets; ++src)
		{
			const GLenum dst_target = s_valid_targets[target];
			const GLenum src_target = s_valid_targets[src];
			const GLenum tex_target = s_valid_targets[target];
			testCase	 test_case  = { tex_target, src_target, dst_target, GL_INVALID_ENUM };

			/* Skip renderbuffers */
			if ((GL_RENDERBUFFER == tex_target) || (GL_RENDERBUFFER == dst_target) || (GL_RENDERBUFFER == src_target))
			{
				continue;
			}

			/* Valid case */
			if (src_target == tex_target)
			{
				test_case.m_expected_result = GL_NO_ERROR;
			}

			/* Skip cases with multisampling conflict */
			if (Utils::isTargetMultisampled(dst_target) != Utils::isTargetMultisampled(src_target))
			{
				continue;
			}

			m_test_cases.push_back(test_case);
		}
	}
}